

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::CtxSwitchARegister::sim_write
          (CtxSwitchARegister *this,pgraph_state *state,uint32_t val)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  bool local_25;
  bool local_1d;
  bool vr;
  bool vre;
  uint32_t val_local;
  pgraph_state *state_local;
  CtxSwitchARegister *this_local;
  
  uVar1 = (this->super_SimpleMmioRegister).super_MmioRegister.super_Register.mask;
  iVar2 = (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[3])
                    (this,state);
  *(uint32_t *)CONCAT44(extraout_var,iVar2) = val & uVar1;
  if ((state->chipset).card_type < 3) {
    local_1d = false;
  }
  else {
    if ((state->chipset).card_type < 0x10) {
      lVar3 = (ulong)state->debug_c << 0x23;
    }
    else {
      lVar3 = (ulong)state->debug_d << 0x2c;
    }
    local_1d = lVar3 < 0;
  }
  local_25 = false;
  if ((long)((ulong)val << 0x20) < 0) {
    local_25 = local_1d;
  }
  state->debug_b = state->debug_b & 0xfffffffe | (uint)local_25;
  if (local_25 != false) {
    pgraph_volatile_reset(state);
  }
  return;
}

Assistant:

void sim_write(struct pgraph_state *state, uint32_t val) override {
		ref(state) = val & mask;
		bool vre;
		if (state->chipset.card_type < 3) {
			vre = false;
		} else if (state->chipset.card_type < 0x10) {
			vre = extr(state->debug_c, 28, 1);
		} else {
			vre = extr(state->debug_d, 19, 1);
		}
		bool vr = extr(val, 31, 1) && vre;
		insrt(state->debug_b, 0, 1, vr);
		if (vr)
			pgraph_volatile_reset(state);
	}